

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,aiMatrix4x4 *absolute_transform,
          aiNode *parent,aiNode *root_node)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar10;
  undefined4 uVar11;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar8;
  aiNode *paVar9;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  pointer paVar15;
  pointer puVar16;
  pointer puVar17;
  uint *puVar18;
  pointer paVar19;
  pointer paVar20;
  value_type_conflict4 *pvVar21;
  pointer ppBVar22;
  pointer ppBVar23;
  pointer ppSVar24;
  ShapeGeometry *this_00;
  pointer ppaVar25;
  pointer ppaVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  aiAnimMesh *paVar32;
  uint uVar33;
  aiVector2D *v;
  aiMesh *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar34;
  aiVector3D *paVar35;
  ulong *puVar36;
  aiFace *paVar37;
  uint *puVar38;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar39;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar40;
  MeshGeometry *this_01;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar41;
  pointer paVar42;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvVar43;
  aiColor4D *__s;
  Skin *pSVar44;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *pvVar45
  ;
  pointer ppBVar46;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar47;
  uint *puVar48;
  pointer ppBVar49;
  aiAnimMesh **ppaVar50;
  pointer paVar51;
  ulong uVar52;
  pointer paVar53;
  size_t sVar54;
  Model *model_00;
  ulong uVar55;
  uint i;
  long lVar56;
  size_t __n;
  aiMesh *paVar57;
  int iVar58;
  aiFace *f;
  aiFace *paVar59;
  long lVar60;
  ulong uVar61;
  float fVar62;
  float fVar63;
  BlendShapeChannel *local_e8;
  aiAnimMesh *animMesh;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  undefined8 local_b8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  float local_80;
  undefined4 uStack_7c;
  MatIndexArray *local_78;
  undefined8 local_68;
  
  local_78 = MeshGeometry::GetMaterialIndices(mesh);
  out = SetupEmptyMesh(this,&mesh->super_Geometry,parent);
  local_b8 = MeshGeometry::GetVertices(mesh);
  pvVar34 = MeshGeometry::GetFaceIndexCounts(mesh);
  out->mNumVertices =
       (int)((ulong)((long)(local_b8->
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_b8->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  paVar51 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  paVar15 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = ((long)paVar15 - (long)paVar51 >> 2) * -0x5555555555555555;
  uVar61 = 0xffffffffffffffff;
  if (SUB168(auVar27 * ZEXT816(0xc),8) == 0) {
    uVar61 = SUB168(auVar27 * ZEXT816(0xc),0);
  }
  paVar35 = (aiVector3D *)operator_new__(uVar61);
  lVar60 = (long)paVar15 - (long)paVar51;
  if (lVar60 != 0) {
    memset(paVar35,0,((lVar60 - 0xcU) / 0xc) * 0xc + 0xc);
  }
  out->mVertices = paVar35;
  paVar51 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  sVar54 = (long)(local_b8->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)paVar51;
  if (sVar54 != 0) {
    memmove(paVar35,paVar51,sVar54);
  }
  out->mNumFaces =
       (uint)((ulong)((long)(pvVar34->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(pvVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 2);
  puVar16 = (pvVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  puVar17 = (pvVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar60 = (long)puVar16 - (long)puVar17;
  uVar61 = lVar60 >> 2;
  puVar36 = (ulong *)operator_new__(-(ulong)(uVar61 >> 0x3c != 0) | lVar60 * 4 + 8U);
  paVar59 = (aiFace *)(puVar36 + 1);
  *puVar36 = uVar61;
  if (puVar16 != puVar17) {
    paVar37 = paVar59;
    do {
      paVar37->mNumIndices = 0;
      paVar37->mIndices = (uint *)0x0;
      paVar37 = paVar37 + 1;
    } while (paVar37 != paVar59 + uVar61);
  }
  out->mFaces = paVar59;
  puVar48 = (pvVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar18 = (pvVar34->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar48 != puVar18) {
    iVar58 = 0;
    do {
      uVar33 = *puVar48;
      uVar61 = (ulong)uVar33;
      paVar59->mNumIndices = uVar33;
      puVar38 = (uint *)operator_new__(uVar61 * 4);
      paVar59->mIndices = puVar38;
      if (uVar33 - 1 < 3) {
        out->mPrimitiveTypes =
             out->mPrimitiveTypes | *(uint *)(&DAT_006eea90 + (ulong)(uVar33 - 1) * 4);
LAB_005d9a73:
        uVar52 = 0;
        do {
          paVar59->mIndices[uVar52] = iVar58 + (int)uVar52;
          uVar52 = uVar52 + 1;
        } while (uVar61 != uVar52);
        iVar58 = iVar58 + (int)uVar52;
      }
      else {
        out->mPrimitiveTypes = out->mPrimitiveTypes | 8;
        if (uVar61 != 0) goto LAB_005d9a73;
      }
      paVar59 = paVar59 + 1;
      puVar48 = puVar48 + 1;
    } while (puVar48 != puVar18);
  }
  pvVar39 = MeshGeometry::GetNormals(mesh);
  lVar60 = (long)(pvVar39->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar39->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar60 != 0) {
    paVar51 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    paVar15 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
    if (lVar60 != (long)paVar15 - (long)paVar51) goto LAB_005da4a0;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = (lVar60 >> 2) * -0x5555555555555555;
    uVar61 = 0xffffffffffffffff;
    if (SUB168(auVar28 * ZEXT816(0xc),8) == 0) {
      uVar61 = SUB168(auVar28 * ZEXT816(0xc),0);
    }
    paVar35 = (aiVector3D *)operator_new__(uVar61);
    lVar60 = (long)paVar15 - (long)paVar51;
    if (lVar60 != 0) {
      memset(paVar35,0,((lVar60 - 0xcU) / 0xc) * 0xc + 0xc);
    }
    out->mNormals = paVar35;
    paVar51 = (pvVar39->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    sVar54 = (long)(pvVar39->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar51;
    if (sVar54 != 0) {
      memmove(paVar35,paVar51,sVar54);
    }
  }
  pvVar40 = MeshGeometry::GetTangents(mesh);
  this_01 = (MeshGeometry *)MeshGeometry::GetBinormals(mesh);
  local_e8 = (BlendShapeChannel *)absolute_transform;
  _local_80 = parent;
  local_68 = root_node;
  if ((pvVar40->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (pvVar40->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_start) goto LAB_005d9db8;
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this_01->super_Geometry).super_Object.element ==
      (Element *)
      ((_Vector_impl_data *)&(this_01->super_Geometry).super_Object._vptr_Object)->_M_start) {
    lVar60 = (long)(pvVar39->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar39->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar60 == 0) goto LAB_005d9da1;
    this_01 = (MeshGeometry *)&tempBinormals;
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_01,
               (lVar60 >> 2) * -0x5555555555555555);
    paVar15 = (pvVar40->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    paVar51 = (pvVar40->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    paVar53 = paVar51;
    if (paVar51 != paVar15) {
      uVar33 = 1;
      uVar61 = 0;
      paVar51 = paVar15;
      do {
        paVar15 = (pvVar39->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        fVar62 = paVar51[uVar61].x;
        fVar1 = paVar15[uVar61].x;
        paVar15 = paVar15 + uVar61;
        uVar3 = paVar15->y;
        uVar10 = paVar15->z;
        uVar4 = paVar51[uVar61].y;
        uVar11 = paVar51[uVar61].z;
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar61].x =
             (float)uVar11 * (float)uVar3 - (float)uVar10 * (float)uVar4;
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar61].y =
             fVar62 * (float)uVar10 - fVar1 * (float)uVar11;
        tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar61].z =
             fVar1 * (float)uVar4 - fVar62 * (float)uVar3;
        uVar61 = (ulong)uVar33;
        paVar51 = (pvVar40->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        paVar53 = (pvVar40->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        uVar52 = ((long)paVar53 - (long)paVar51 >> 2) * -0x5555555555555555;
        uVar33 = uVar33 + 1;
      } while (uVar61 <= uVar52 && uVar52 - uVar61 != 0);
    }
  }
  else {
    paVar51 = (pvVar40->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    paVar53 = (pvVar40->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  }
LAB_005d9b90:
  paVar15 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  paVar19 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  lVar60 = (long)paVar19 - (long)paVar15;
  if ((long)paVar53 - (long)paVar51 != lVar60) {
    __assert_fail("tangents.size() == vertices.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x480,
                  "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode *, aiNode *)"
                 );
  }
  if ((long)(this_01->super_Geometry).super_Object.element -
      (long)((_Vector_impl_data *)&(this_01->super_Geometry).super_Object._vptr_Object)->_M_start !=
      (long)paVar53 - (long)paVar51) {
    __assert_fail("binormals->size() == vertices.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                  ,0x481,
                  "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode *, aiNode *)"
                 );
  }
  auVar29._8_8_ = 0;
  auVar29._0_8_ = (lVar60 >> 2) * -0x5555555555555555;
  uVar61 = 0xffffffffffffffff;
  if (SUB168(auVar29 * ZEXT816(0xc),8) == 0) {
    uVar61 = SUB168(auVar29 * ZEXT816(0xc),0);
  }
  paVar35 = (aiVector3D *)operator_new__(uVar61);
  lVar60 = (long)paVar19 - (long)paVar15;
  if (lVar60 != 0) {
    memset(paVar35,0,((lVar60 - 0xcU) / 0xc) * 0xc + 0xc);
  }
  out->mTangents = paVar35;
  paVar51 = (pvVar40->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  sVar54 = (long)(pvVar40->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)paVar51;
  if (sVar54 != 0) {
    memmove(paVar35,paVar51,sVar54);
  }
  paVar51 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  paVar15 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = ((long)paVar15 - (long)paVar51 >> 2) * -0x5555555555555555;
  uVar61 = 0xffffffffffffffff;
  if (SUB168(auVar30 * ZEXT816(0xc),8) == 0) {
    uVar61 = SUB168(auVar30 * ZEXT816(0xc),0);
  }
  paVar35 = (aiVector3D *)operator_new__(uVar61);
  lVar60 = (long)paVar15 - (long)paVar51;
  if (lVar60 != 0) {
    memset(paVar35,0,((lVar60 - 0xcU) / 0xc) * 0xc + 0xc);
  }
  out->mBitangents = paVar35;
  paVar51 = ((_Vector_impl_data *)&(this_01->super_Geometry).super_Object._vptr_Object)->_M_start;
  sVar54 = (long)(this_01->super_Geometry).super_Object.element - (long)paVar51;
  if (sVar54 != 0) {
    memmove(paVar35,paVar51,sVar54);
  }
LAB_005d9da1:
  if (tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tempBinormals.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)tempBinormals.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tempBinormals.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_005d9db8:
  lVar60 = 0;
  do {
    pvVar41 = MeshGeometry::GetTextureCoords(mesh,(uint)lVar60);
    if ((pvVar41->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (pvVar41->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish) break;
    paVar51 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    paVar15 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = ((long)paVar15 - (long)paVar51 >> 2) * -0x5555555555555555;
    uVar61 = SUB168(auVar31 * ZEXT816(0xc),0);
    if (SUB168(auVar31 * ZEXT816(0xc),8) != 0) {
      uVar61 = 0xffffffffffffffff;
    }
    paVar35 = (aiVector3D *)operator_new__(uVar61);
    lVar56 = (long)paVar15 - (long)paVar51;
    if (lVar56 != 0) {
      memset(paVar35,0,((lVar56 - 0xcU) / 0xc) * 0xc + 0xc);
    }
    out->mTextureCoords[lVar60] = paVar35;
    paVar20 = (pvVar41->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (paVar42 = (pvVar41->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start; paVar42 != paVar20;
        paVar42 = paVar42 + 1) {
      fVar62 = paVar42->y;
      paVar35->x = paVar42->x;
      paVar35->y = fVar62;
      paVar35->z = 0.0;
      paVar35 = paVar35 + 1;
    }
    out->mNumUVComponents[lVar60] = 2;
    lVar60 = lVar60 + 1;
  } while (lVar60 != 8);
  uVar61 = 0;
  do {
    paVar57 = (aiMesh *)(uVar61 & 0xffffffff);
    pvVar43 = MeshGeometry::GetVertexColors(mesh,(uint)uVar61);
    if ((pvVar43->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar43->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
        super__Vector_impl_data._M_finish) break;
    paVar51 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
    paVar15 = (local_b8->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    lVar60 = (long)paVar51 - (long)paVar15 >> 2;
    __n = lVar60 * -0x5555555555555550;
    sVar54 = __n;
    if (0xfffffffffffffff < (ulong)(lVar60 * -0x5555555555555555)) {
      sVar54 = 0xffffffffffffffff;
    }
    __s = (aiColor4D *)operator_new__(sVar54);
    if (paVar51 != paVar15) {
      memset(__s,0,__n);
    }
    out->mColors[uVar61] = __s;
    paVar57 = (aiMesh *)
              (pvVar43->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    sVar54 = (long)(pvVar43->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)paVar57;
    if (sVar54 != 0) {
      memmove(__s,paVar57,sVar54);
    }
    uVar61 = uVar61 + 1;
  } while (uVar61 != 8);
  if ((this->doc->settings->readMaterials == true) &&
     (pvVar21 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start,
     pvVar21 !=
     (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
     _M_finish)) {
    paVar57 = out;
    ConvertMaterialForMesh(this,out,model,mesh,*pvVar21);
  }
  else {
    LogFunctions<Assimp::FBXImporter>::LogError((char *)0x5d9f8d);
    uVar33 = GetDefaultMaterial(this);
    out->mMaterialIndex = uVar33;
  }
  if ((this->doc->settings->readWeights == true) &&
     (pSVar44 = Geometry::DeformerSkin(&mesh->super_Geometry), pSVar44 != (Skin *)0x0)) {
    paVar57 = out;
    ConvertWeights(this,out,model_00,mesh,(aiMatrix4x4 *)local_e8,(aiNode *)_local_80,local_68,
                   0xffffffff,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  }
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar45 = Geometry::GetBlendShapes(&mesh->super_Geometry);
  ppBVar46 = (pvVar45->
             super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppBVar22 = (pvVar45->
             super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar46 != ppBVar22) {
    model = (Model *)&tempBinormals;
    do {
      ppBVar23 = ((*ppBVar46)->blendShapeChannels).
                 super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      for (ppBVar49 = ((*ppBVar46)->blendShapeChannels).
                      super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppBVar49 != ppBVar23;
          ppBVar49 = ppBVar49 + 1) {
        local_e8 = *ppBVar49;
        if ((local_e8->shapeGeometries).
            super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (local_e8->shapeGeometries).
            super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar61 = 0;
          do {
            animMesh = aiCreateAnimMesh(out);
            ppSVar24 = (local_e8->shapeGeometries).
                       super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(local_e8->shapeGeometries).
                              super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar24 >> 3) <=
                uVar61) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar61);
              goto LAB_005da492;
            }
            this_00 = ppSVar24[uVar61];
            pvVar39 = ShapeGeometry::GetVertices(this_00);
            pvVar47 = ShapeGeometry::GetNormals(this_00);
            pvVar40 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                      ShapeGeometry::GetIndices(this_00);
            paVar32 = animMesh;
            FixAnimMeshName((string *)model,(FBXConverter *)paVar57,
                            &(this_00->super_Geometry).super_Object.name);
            paVar51 = tempBinormals.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (tempBinormals.
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_finish < (pointer)0x400) {
              (paVar32->mName).length =
                   (ai_uint32)
                   tempBinormals.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
              memcpy((paVar32->mName).data,
                     tempBinormals.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (size_t)tempBinormals.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
              (paVar32->mName).data[(long)paVar51] = '\0';
            }
            if (tempBinormals.
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pointer)&tempBinormals.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(tempBinormals.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (ulong)((long)&(tempBinormals.
                                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->x
                                     + 1));
            }
            paVar51 = (pvVar40->
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            if ((pvVar40->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish != paVar51) {
              uVar52 = 0;
              do {
                paVar15 = (pvVar39->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                uVar55 = ((long)(pvVar39->
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)paVar15 >> 2) *
                         -0x5555555555555555;
                if (uVar55 < uVar52 || uVar55 - uVar52 == 0) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar52);
LAB_005da468:
                  paVar51 = (pointer)std::__throw_out_of_range_fmt
                                               ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                                ,uVar52);
                  paVar53 = paVar51;
                  this_01 = mesh;
                  goto LAB_005d9b90;
                }
                paVar53 = (pvVar47->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                uVar55 = ((long)(pvVar47->
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)paVar53 >> 2) *
                         -0x5555555555555555;
                if (uVar55 < uVar52 || uVar55 - uVar52 == 0) goto LAB_005da468;
                pvVar8 = *(vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> **)
                          (paVar15 + uVar52);
                fVar62 = paVar15[uVar52].z;
                local_78 = (MatIndexArray *)CONCAT44(local_78._4_4_,fVar62);
                paVar9 = *(aiNode **)(paVar53 + uVar52);
                fVar1 = paVar53[uVar52].z;
                local_80 = fVar1;
                tempBinormals.
                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)((ulong)tempBinormals.
                                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000
                              );
                puVar48 = MeshGeometry::ToOutputVertexIndex
                                    (mesh,(uint)(&paVar51->x)[uVar52],(uint *)model);
                local_b8._0_4_ = SUB84(pvVar8,0);
                local_b8._4_4_ = (float)((ulong)pvVar8 >> 0x20);
                local_68._0_4_ = SUB84(paVar9,0);
                local_68._4_4_ = (float)((ulong)paVar9 >> 0x20);
                if ((int)tempBinormals.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start != 0) {
                  uVar55 = 0;
                  do {
                    uVar33 = puVar48[uVar55];
                    paVar35 = animMesh->mVertices;
                    uVar5 = paVar35[uVar33].x;
                    uVar12 = paVar35[uVar33].y;
                    paVar35[uVar33].x = (float)uVar5 + (float)local_b8;
                    paVar35[uVar33].y = (float)uVar12 + local_b8._4_4_;
                    paVar35[uVar33].z = paVar35[uVar33].z + fVar62;
                    paVar35 = animMesh->mNormals;
                    if (paVar35 != (aiVector3D *)0x0) {
                      uVar6 = paVar35[uVar33].x;
                      uVar13 = paVar35[uVar33].y;
                      paVar35[uVar33].x = (float)uVar6 + (float)local_68;
                      paVar35[uVar33].y = (float)uVar13 + local_68._4_4_;
                      paVar35[uVar33].z = paVar35[uVar33].z + fVar1;
                      paVar35 = animMesh->mNormals;
                      uVar7 = paVar35[uVar33].x;
                      uVar14 = paVar35[uVar33].y;
                      fVar2 = paVar35[uVar33].z;
                      fVar63 = SQRT(fVar2 * fVar2 +
                                    (float)uVar7 * (float)uVar7 + (float)uVar14 * (float)uVar14);
                      if (0.0 < fVar63) {
                        paVar35 = paVar35 + uVar33;
                        fVar63 = 1.0 / fVar63;
                        paVar35->x = (float)uVar7 * fVar63;
                        paVar35->y = (float)uVar14 * fVar63;
                        paVar35->z = fVar2 * fVar63;
                      }
                    }
                    uVar55 = uVar55 + 1;
                  } while (uVar55 < ((ulong)tempBinormals.
                                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff))
                  ;
                }
                uVar52 = uVar52 + 1;
                paVar51 = (pvVar40->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                local_b8 = pvVar8;
                local_68 = paVar9;
              } while (uVar52 < (ulong)((long)(pvVar40->
                                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                              )._M_impl.super__Vector_impl_data._M_finish -
                                        (long)paVar51 >> 2));
            }
            fVar62 = 1.0;
            if (8 < (ulong)((long)(local_e8->shapeGeometries).
                                  super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_e8->shapeGeometries).
                                 super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start)) {
              fVar62 = local_e8->percent / 100.0;
            }
            animMesh->mWeight = fVar62;
            paVar57 = (aiMesh *)
                      animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            if (animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiAnimMesh*,std::allocator<aiAnimMesh*>>::
              _M_realloc_insert<aiAnimMesh*const&>
                        ((vector<aiAnimMesh*,std::allocator<aiAnimMesh*>> *)&animMeshes,
                         (iterator)
                         animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&animMesh);
            }
            else {
              *animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish = animMesh;
              animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar61 = uVar61 + 1;
          } while (uVar61 < (ulong)((long)(local_e8->shapeGeometries).
                                          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(local_e8->shapeGeometries).
                                          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
      }
      ppBVar46 = ppBVar46 + 1;
    } while (ppBVar46 != ppBVar22);
  }
  if ((long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar61 = (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    out->mNumAnimMeshes = (uint)uVar61;
    ppaVar50 = (aiAnimMesh **)
               operator_new__(-(ulong)(uVar61 >> 0x3d != 0) |
                              (long)animMeshes.
                                    super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)animMeshes.
                                    super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
    out->mAnimMeshes = ppaVar50;
    uVar52 = 0;
    do {
      if ((ulong)((long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar52) goto LAB_005da492;
      out->mAnimMeshes[uVar52] =
           animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar52];
      uVar52 = uVar52 + 1;
    } while (uVar61 + (uVar61 == 0) != uVar52);
  }
  ppaVar25 = (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppaVar26 = (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (int)((ulong)((long)ppaVar26 - (long)ppaVar25) >> 3) - 1;
LAB_005da492:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_005da4a0:
  __assert_fail("normals.size() == vertices.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                ,0x463,
                "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode *, aiNode *)"
               );
}

Assistant:

unsigned int FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &mesh, const Model &model,
                                                             const aiMatrix4x4 &absolute_transform, aiNode *parent,
                                                             aiNode *root_node)
        {
            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, parent);

            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            // copy vertices
            out_mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
            out_mesh->mVertices = new aiVector3D[vertices.size()];

            std::copy(vertices.begin(), vertices.end(), out_mesh->mVertices);

            // generate dummy faces
            out_mesh->mNumFaces = static_cast<unsigned int>(faces.size());
            aiFace* fac = out_mesh->mFaces = new aiFace[faces.size()]();

            unsigned int cursor = 0;
            for (unsigned int pcount : faces) {
                aiFace& f = *fac++;
                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i) {
                    f.mIndices[i] = cursor++;
                }
            }

            // copy normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());

                out_mesh->mNormals = new aiVector3D[vertices.size()];
                std::copy(normals.begin(), normals.end(), out_mesh->mNormals);
            }

            // copy tangents - assimp requires both tangents and bitangents (binormals)
            // to be present, or neither of them. Compute binormals from normals
            // and tangents if needed.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();

            if (tangents.size()) {
                std::vector<aiVector3D> tempBinormals;
                if (!binormals->size()) {
                    if (normals.size()) {
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = nullptr;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size());
                    ai_assert(binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    std::copy(tangents.begin(), tangents.end(), out_mesh->mTangents);

                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                    std::copy(binormals->begin(), binormals->end(), out_mesh->mBitangents);
                }
            }

            // copy texture coords
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                aiVector3D* out_uv = out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                for (const aiVector2D& v : uvs) {
                    *out_uv++ = aiVector3D(v.x, v.y, 0.0f);
                }

                out_mesh->mNumUVComponents[i] = 2;
            }

            // copy vertex colors
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
                std::copy(colors.begin(), colors.end(), out_mesh->mColors[i]);
            }

            if (!doc.Settings().readMaterials || mindices.empty()) {
                FBXImporter::LogError("no material assigned to mesh, setting default material");
                out_mesh->mMaterialIndex = GetDefaultMaterial();
            }
            else {
                ConvertMaterialForMesh(out_mesh, model, mesh, mindices[0]);
            }

            if (doc.Settings().readWeights && mesh.DeformerSkin() != nullptr) {
                ConvertWeights(out_mesh, model, mesh, absolute_transform, parent, root_node, NO_MATERIAL_SEPARATION,
                               nullptr);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh *animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int index = outIndices[k];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }
            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }
            return static_cast<unsigned int>(meshes.size() - 1);
        }